

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

libssh2_socket_t open_socket_to_container(char *container_id)

{
  int iVar1;
  long lVar2;
  char *local_50;
  char *env;
  libssh2_socket_t local_40;
  int res;
  libssh2_socket_t ret;
  int counter;
  sockaddr_in sin;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char *port_string;
  char *ip_address;
  char *container_id_local;
  
  port_string = (char *)0x0;
  _sock = (char *)0x0;
  local_40 = -1;
  ip_address = container_id;
  if (have_docker == 0) {
    local_50 = getenv("OPENSSH_SERVER_HOST");
    if (local_50 == (char *)0x0) {
      local_50 = "127.0.0.1";
    }
    port_string = strdup(local_50);
    local_50 = openssh_server_port();
    if (local_50 == (char *)0x0) {
      local_50 = "4711";
    }
    _sock = strdup(local_50);
  }
  else {
    iVar1 = ip_address_from_container(container_id,&port_string);
    if (iVar1 != 0) {
      fprintf(_stderr,"Failed to get IP address for container %s\n",ip_address);
      goto LAB_0010b061;
    }
    iVar1 = port_from_container(ip_address,(char **)&sock);
    if (iVar1 != 0) {
      fprintf(_stderr,"Failed to get port for container %s\n",ip_address);
      goto LAB_0010b061;
    }
  }
  if ((port_string != (char *)0x0) && (iVar1 = strcmp(port_string,"0.0.0.0"), iVar1 == 0)) {
    free(port_string);
    port_string = strdup("127.0.0.1");
  }
  sin.sin_zero._4_4_ = inet_addr(port_string);
  if (sin.sin_zero._4_4_ == 0xffffffff) {
    fprintf(_stderr,"Failed to convert %s host address\n",port_string);
  }
  else {
    sin.sin_zero._0_4_ = socket(2,1,0);
    if (sin.sin_zero._0_4_ == -1) {
      fprintf(_stderr,"Failed to open socket (%d)\n",0xffffffff);
    }
    else {
      ret._0_2_ = 2;
      lVar2 = strtol(_sock,(char **)0x0,0);
      ret._2_2_ = htons((uint16_t)lVar2);
      counter._0_1_ = sin.sin_zero[4];
      counter._1_1_ = sin.sin_zero[5];
      counter._2_1_ = sin.sin_zero[6];
      counter._3_1_ = sin.sin_zero[7];
      for (res = 0; res < 3; res = res + 1) {
        iVar1 = connect(sin.sin_zero._0_4_,(sockaddr *)&ret,0x10);
        if (iVar1 == 0) {
          local_40._0_1_ = sin.sin_zero[0];
          local_40._1_1_ = sin.sin_zero[1];
          local_40._2_1_ = sin.sin_zero[2];
          local_40._3_1_ = sin.sin_zero[3];
          break;
        }
        fprintf(_stderr,"Connection to %s:%s attempt #%d failed: retrying...\n",port_string,_sock,
                (ulong)(uint)res);
        portable_sleep(res * 2 + 1);
      }
      if (local_40 == -1) {
        fprintf(_stderr,"Failed to connect to %s:%s\n",port_string,_sock);
      }
    }
  }
LAB_0010b061:
  free(port_string);
  free(_sock);
  return local_40;
}

Assistant:

static libssh2_socket_t open_socket_to_container(char *container_id)
{
    char *ip_address = NULL;
    char *port_string = NULL;
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    int counter;
    libssh2_socket_t ret = LIBSSH2_INVALID_SOCKET;

    if(have_docker) {
        int res;
        res = ip_address_from_container(container_id, &ip_address);
        if(res) {
            fprintf(stderr, "Failed to get IP address for container %s\n",
                    container_id);
            goto cleanup;
        }

        res = port_from_container(container_id, &port_string);
        if(res) {
            fprintf(stderr, "Failed to get port for container %s\n",
                    container_id);
            goto cleanup;
        }
    }
    else {
        const char *env;
        env = getenv("OPENSSH_SERVER_HOST");
        if(!env) {
            env = "127.0.0.1";
        }
        ip_address = strdup(env);
        env = openssh_server_port();
        if(!env) {
            env = "4711";
        }
        port_string = strdup(env);
    }

    /* 0.0.0.0 is returned by Docker for Windows, because the container
       is reachable from anywhere. But we cannot connect to 0.0.0.0,
       instead we assume localhost and try to connect to 127.0.0.1. */
    if(ip_address && strcmp(ip_address, "0.0.0.0") == 0) {
        free(ip_address);
        ip_address = strdup("127.0.0.1");
    }

    hostaddr = inet_addr(ip_address);
    if(hostaddr == (uint32_t)(-1)) {
        fprintf(stderr, "Failed to convert %s host address\n", ip_address);
        goto cleanup;
    }

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr,
                "Failed to open socket (" LIBSSH2_SOCKET_MASK ")\n", sock);
        goto cleanup;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((short)strtol(port_string, NULL, 0));
    sin.sin_addr.s_addr = hostaddr;

    for(counter = 0; counter < 3; ++counter) {
        if(connect(sock, (struct sockaddr*)(&sin),
                   sizeof(struct sockaddr_in))) {
            fprintf(stderr,
                    "Connection to %s:%s attempt #%d failed: retrying...\n",
                    ip_address, port_string, counter);
            portable_sleep(1 + 2*counter);
        }
        else {
            ret = sock;
            break;
        }
    }
    if(ret == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "Failed to connect to %s:%s\n",
                ip_address, port_string);
        goto cleanup;
    }

cleanup:
    free(ip_address);
    free(port_string);

    return ret;
}